

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingPriorityQueue.hpp
# Opt level: O2

void __thiscall
gmlc::containers::BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable>::
push<helics::ActionMessage&>
          (BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable> *this,
          ActionMessage *val)

{
  bool bVar1;
  BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable> *this_00;
  bool expEmpty;
  unique_lock<std::mutex> pushLock;
  unique_lock<std::mutex> pullLock;
  
  std::unique_lock<std::mutex>::unique_lock(&pushLock,(mutex_type *)this);
  this_00 = this + 0x50;
  if (*(long *)(this + 0x50) == *(long *)(this + 0x58)) {
    expEmpty = true;
    bVar1 = std::atomic<bool>::compare_exchange_strong
                      ((atomic<bool> *)(this + 0x80),&expEmpty,false,seq_cst);
    if (bVar1) {
      std::unique_lock<std::mutex>::unlock(&pushLock);
      std::unique_lock<std::mutex>::unique_lock(&pullLock,(mutex_type *)(this + 0x28));
      LOCK();
      this[0x80] = (BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable>)
                   0x0;
      UNLOCK();
      if (*(long *)(this + 0x68) == *(long *)(this + 0x70)) {
        this_00 = this + 0x68;
      }
      else {
        std::unique_lock<std::mutex>::lock(&pushLock);
      }
      std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
                ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)this_00,
                 val);
      std::condition_variable::notify_all();
      std::unique_lock<std::mutex>::~unique_lock(&pullLock);
    }
    else {
      std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
                ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)this_00,
                 val);
      expEmpty = true;
      bVar1 = std::atomic<bool>::compare_exchange_strong
                        ((atomic<bool> *)(this + 0x80),&expEmpty,false,seq_cst);
      if (bVar1) {
        std::condition_variable::notify_all();
      }
    }
  }
  else {
    std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
              ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)this_00,val)
    ;
  }
  std::unique_lock<std::mutex>::~unique_lock(&pushLock);
  return;
}

Assistant:

void push(Z&& val)  // forwarding reference
        {
            std::unique_lock<MUTEX> pushLock(
                m_pushLock);  // only one lock on this branch
            if (pushElements.empty()) {
                bool expEmpty = true;
                if (queueEmptyFlag.compare_exchange_strong(expEmpty, false)) {
                    // release the push lock so we don't get a potential
                    // deadlock condition
                    pushLock.unlock();
                    std::unique_lock<MUTEX> pullLock(
                        m_pullLock);  // first pullLock
                    queueEmptyFlag = false;
                    if (pullElements.empty()) {
                        pullElements.push_back(std::forward<Z>(val));
                        // pullLock.unlock ();
                    } else {
                        pushLock.lock();
                        pushElements.push_back(std::forward<Z>(val));
                    }
                    condition.notify_all();
                    return;
                } else {
                    pushElements.push_back(std::forward<Z>(val));
                    expEmpty = true;
                    if (queueEmptyFlag.compare_exchange_strong(
                            expEmpty, false)) {
                        condition.notify_all();
                    }
                    return;
                }
            }
            pushElements.push_back(std::forward<Z>(val));
        }